

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_remove(Context *context,IntrinsicResult *partialResult)

{
  char *__filename;
  Value local_70;
  int local_60;
  int err;
  String local_50;
  undefined1 local_40 [24];
  String path;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_50,"path");
  MiniScript::Context::GetVar((Context *)local_40,(String *)partialResult,(LocalOnlyMode)&local_50);
  MiniScript::Value::ToString((Value *)(local_40 + 0x10),(Machine *)local_40);
  MiniScript::Value::~Value((Value *)local_40);
  MiniScript::String::~String(&local_50);
  __filename = MiniScript::String::c_str((String *)(local_40 + 0x10));
  local_60 = remove(__filename);
  MiniScript::Value::Truth(&local_70,local_60 == 0);
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_70,true);
  MiniScript::Value::~Value(&local_70);
  MiniScript::String::~String((String *)(local_40 + 0x10));
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_remove(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("path").ToString();
	#if _WIN32 || _WIN64
		bool isDir = false;
		struct _stati64 stats;
		if (_stati64(path.c_str(), &stats) == 0) {
			isDir = ((stats.st_mode & _S_IFDIR) != 0);
		}
		bool ok;
		if (isDir) ok = RemoveDirectory(path.c_str());
		else ok = DeleteFile(path.c_str());
		int err = ok ? 0 : 1;
	#else
		int err = remove(path.c_str());
	#endif
	return IntrinsicResult(Value::Truth(err == 0));
}